

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

buffer_appender<char>
fmt::v7::detail::
write_padded<(fmt::v7::align::type)2,fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::float_writer<char>>
          (buffer_appender<char> out,basic_format_specs<char> *specs,size_t size,size_t width,
          float_writer<char> *f)

{
  type tVar1;
  ulong n;
  size_t sVar2;
  buffer_appender<char> bVar3;
  ulong local_b0;
  buffer_appender<char> it;
  size_t left_padding;
  char *shifts;
  size_t padding;
  uint spec_width;
  float_writer<char> *f_local;
  size_t width_local;
  size_t size_local;
  basic_format_specs<char> *specs_local;
  buffer_appender<char> out_local;
  
  tVar1 = to_unsigned<int>(specs->width);
  if (width < tVar1) {
    local_b0 = tVar1 - width;
  }
  else {
    local_b0 = 0;
  }
  n = local_b0 >>
      (*(byte *)((long)&basic_data<void>::right_padding_shifts + (ulong)(specs->field_0x9 & 0xf)) &
      0x3f);
  sVar2 = fill_t<char>::size(&specs->fill);
  bVar3 = reserve<char>(out,size + local_b0 * sVar2);
  bVar3 = fill<fmt::v7::detail::buffer_appender<char>,char>(bVar3,n,&specs->fill);
  bVar3 = float_writer<char>::operator()(f,bVar3);
  bVar3 = fill<fmt::v7::detail::buffer_appender<char>,char>(bVar3,local_b0 - n,&specs->fill);
  bVar3 = base_iterator<fmt::v7::detail::buffer_appender<char>>(out,bVar3);
  return (buffer_appender<char>)
         bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
}

Assistant:

inline OutputIt write_padded(OutputIt out,
                             const basic_format_specs<Char>& specs, size_t size,
                             size_t width, const F& f) {
  static_assert(align == align::left || align == align::right, "");
  unsigned spec_width = to_unsigned(specs.width);
  size_t padding = spec_width > width ? spec_width - width : 0;
  auto* shifts = align == align::left ? data::left_padding_shifts
                                      : data::right_padding_shifts;
  size_t left_padding = padding >> shifts[specs.align];
  auto it = reserve(out, size + padding * specs.fill.size());
  it = fill(it, left_padding, specs.fill);
  it = f(it);
  it = fill(it, padding - left_padding, specs.fill);
  return base_iterator(out, it);
}